

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O3

void matchit::impl::
     PatternTraits<matchit::impl::Id<std::map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>
     ::processIdImpl(Id<std::map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
                     *idPat,int32_t depth,IdProcess idProcess)

{
  IdBlockBase<std::map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
  *pIVar1;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
  local_a;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
  local_9;
  
  if (idProcess == kCONFIRM) {
    pIVar1 = &std::
              visit<matchit::impl::Overload<matchit::impl::Id<std::map<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>,mathiu::impl::ExprPtrLess,std::allocator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>>::block()const::_lambda(matchit::impl::IdBlock<std::map<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>,mathiu::impl::ExprPtrLess,std::allocator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>>&)_1_,matchit::impl::Id<std::map<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>,mathiu::impl::ExprPtrLess,std::allocator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>>::block()const::_lambda(matchit::impl::IdBlock<std::map<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>,mathiu::impl::ExprPtrLess,std::allocator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>>*)_1_>,std::variant<matchit::impl::IdBlock<std::map<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>,mathiu::impl::ExprPtrLess,std::allocator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>>,matchit::impl::IdBlock<std::map<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>,mathiu::impl::ExprPtrLess,std::allocator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>>*>&>
                        (&local_9,&idPat->mBlock)->
              super_IdBlockBase<std::map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
    ;
    IdBlockBase<std::map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
    ::confirm(pIVar1,depth);
  }
  else if (idProcess == kCANCEL) {
    pIVar1 = &std::
              visit<matchit::impl::Overload<matchit::impl::Id<std::map<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>,mathiu::impl::ExprPtrLess,std::allocator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>>::block()const::_lambda(matchit::impl::IdBlock<std::map<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>,mathiu::impl::ExprPtrLess,std::allocator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>>&)_1_,matchit::impl::Id<std::map<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>,mathiu::impl::ExprPtrLess,std::allocator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>>::block()const::_lambda(matchit::impl::IdBlock<std::map<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>,mathiu::impl::ExprPtrLess,std::allocator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>>*)_1_>,std::variant<matchit::impl::IdBlock<std::map<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>,mathiu::impl::ExprPtrLess,std::allocator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>>,matchit::impl::IdBlock<std::map<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>,mathiu::impl::ExprPtrLess,std::allocator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>>*>&>
                        (&local_a,&idPat->mBlock)->
              super_IdBlockBase<std::map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
    ;
    IdBlockBase<std::map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>
    ::reset(pIVar1,depth);
  }
  return;
}

Assistant:

constexpr static void processIdImpl(Id<Type> const &idPat, int32_t depth,
                                                IdProcess idProcess)
            {
                switch (idProcess)
                {
                case IdProcess::kCANCEL:
                    idPat.reset(depth);
                    break;

                case IdProcess::kCONFIRM:
                    idPat.confirm(depth);
                    break;
                }
            }